

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O0

void test_read_format_rar5_decode_number_out_of_bounds_read(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a_00;
  la_ssize_t lVar3;
  archive *a;
  archive_entry *ae;
  char buf [4096];
  
  extract_reference_file("test_read_format_rar5_decode_number_out_of_bounds_read.rar");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ջ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ջ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ջ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename
                    (a_00,"test_read_format_rar5_decode_number_out_of_bounds_read.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ջ',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_decode_number_out_of_bounds_read.rar\", 10240)"
                   ,a_00);
  archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  do {
    lVar3 = archive_read_data((archive *)a_00,&ae,0x1000);
  } while (0 < lVar3);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'Ք',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'Ք',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_decode_number_out_of_bounds_read)
{
	/* oss fuzz 30448 */

	char buf[4096];
	PROLOGUE("test_read_format_rar5_decode_number_out_of_bounds_read.rar");

	/* Return codes of those calls are ignored, because this sample file
	 * is invalid. However, the unpacker shouldn't produce any SIGSEGV
	 * errors during processing. */

	(void) archive_read_next_header(a, &ae);
	while(0 < archive_read_data(a, buf, sizeof(buf))) {}

	EPILOGUE();
}